

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values_tests.cpp
# Opt level: O1

int test::iu_ValuesTest_x_iutest_x_Test_Test::AddRegister(void)

{
  pointer pcVar1;
  int iVar2;
  UnitTest *pUVar3;
  string *psVar4;
  ParamTestSuiteInfo<test::ValuesTest> *this;
  string local_58;
  string local_38;
  
  if (AddRegister()::testinfo == '\0') {
    iVar2 = __cxa_guard_acquire(&AddRegister()::testinfo);
    if (iVar2 != 0) {
      AddRegister::testinfo.super_IParamTestInfoData._vptr_IParamTestInfoData =
           (_func_int **)&PTR__IParamTestInfoData_003aa7d0;
      AddRegister::testinfo.super_IParamTestInfoData.m_name._M_dataplus._M_p =
           (pointer)&AddRegister::testinfo.super_IParamTestInfoData.m_name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&AddRegister::testinfo.super_IParamTestInfoData.m_name,"Test","");
      AddRegister::testinfo.super_IParamTestInfoData._vptr_IParamTestInfoData =
           (_func_int **)&PTR__IParamTestInfoData_003b7b60;
      __cxa_atexit(iutest::detail::IParamTestInfoData::~IParamTestInfoData,&AddRegister::testinfo,
                   &__dso_handle);
      __cxa_guard_release(&AddRegister()::testinfo);
    }
  }
  pUVar3 = iutest::UnitTest::instance();
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ValuesTest","");
  psVar4 = iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname__abi_cxx11_();
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + psVar4->_M_string_length);
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<test::ValuesTest>
                   (&pUVar3->m_param_testsuite_holder,&local_38,&local_58);
  iutest::detail::IParamTestSuiteInfo::AddTestPattern
            (&this->super_IParamTestSuiteInfo,&AddRegister::testinfo.super_IParamTestInfoData);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

IUTEST_P(ValuesTest, Test)
{
}